

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters_task
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,uint64 data,void *pData_ptr)

{
  undefined4 uVar1;
  uint uVar2;
  uint *puVar3;
  crn_thread_id_t cVar4;
  vector<unsigned_int> *this_00;
  undefined8 *in_RDX;
  clusterizer<crnlib::vec<16U,_float>_> *in_RSI;
  long in_RDI;
  byte bVar5;
  uint j;
  vector<unsigned_int> *indices;
  uint i_1;
  uint num_clusters;
  bool quick;
  bool is_main_thread;
  weighted_vec *v;
  uint index;
  uint i;
  create_clusters_task_state *state;
  uint partition_index;
  bool in_stack_000000ff;
  void *in_stack_00000100;
  progress_callback_func_ptr in_stack_00000108;
  uint in_stack_00000114;
  clusterizer<crnlib::vec<16U,_float>_> *in_stack_00000118;
  clusterizer<crnlib::vec<16U,_float>_> *in_stack_ffffffffffffff70;
  vector<unsigned_int> *this_01;
  uint local_54;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar6;
  uint i_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 *puVar7;
  uint max_clusters;
  
  if ((*(byte *)(in_RDI + 0x1e8) & 1) == 0) {
    uVar1 = SUB84(in_RSI,0);
    puVar7 = in_RDX;
    clusterizer<crnlib::vec<16U,_float>_>::clear(in_stack_ffffffffffffff70);
    local_2c = 0;
    while( true ) {
      uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)in_RDX[1]);
      max_clusters = (uint)((ulong)puVar7 >> 0x20);
      if (uVar2 <= local_2c) break;
      puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)in_RDX[1],local_2c);
      vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::operator[]
                ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
                 *in_RDX,*puVar3);
      clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                ((clusterizer<crnlib::vec<16U,_float>_> *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,
                                   CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))),
                 (vec<16U,_float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      local_2c = local_2c + 1;
    }
    if ((*(byte *)(in_RDI + 0x1e8) & 1) == 0) {
      cVar4 = crn_get_current_thread_id();
      bVar5 = cVar4 == *(crn_thread_id_t *)(in_RDI + 8);
      clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
                (in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000100,
                 in_stack_000000ff);
      if ((bVar5 & 1) != 0) {
        *(undefined1 *)(in_RDI + 0x1d0) = 1;
      }
      if ((*(byte *)(in_RDI + 0x1e8) & 1) == 0) {
        clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                  ((clusterizer<crnlib::vec<16U,_float>_> *)0x185ff6);
        clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
                  (in_RSI,max_clusters,
                   (vector<crnlib::vector<unsigned_int>_> *)
                   CONCAT44(uVar1,in_stack_ffffffffffffffe0));
        uVar6 = 0;
        while (i_00 = uVar6,
              uVar2 = vector<crnlib::vector<unsigned_int>_>::size
                                ((vector<crnlib::vector<unsigned_int>_> *)(in_RDX + 2)),
              uVar6 < uVar2) {
          this_00 = vector<crnlib::vector<unsigned_int>_>::operator[]
                              ((vector<crnlib::vector<unsigned_int>_> *)(in_RDX + 2),i_00);
          for (local_54 = 0; uVar2 = vector<unsigned_int>::size(this_00), local_54 < uVar2;
              local_54 = local_54 + 1) {
            this_01 = (vector<unsigned_int> *)in_RDX[1];
            puVar3 = vector<unsigned_int>::operator[](this_00,local_54);
            puVar3 = vector<unsigned_int>::operator[](this_01,*puVar3);
            uVar6 = *puVar3;
            puVar3 = vector<unsigned_int>::operator[](this_00,local_54);
            *puVar3 = uVar6;
          }
          uVar6 = i_00 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void create_clusters_task(uint64 data, void* pData_ptr) {
    if (m_canceled)
      return;

    const uint partition_index = static_cast<uint>(data);
    create_clusters_task_state& state = *static_cast<create_clusters_task_state*>(pData_ptr);

    m_clusterizers[partition_index].clear();

    for (uint i = 0; i < state.m_pIndices->size(); i++) {
      const uint index = (*state.m_pIndices)[i];
      const weighted_vec& v = (*state.m_pWeighted_vecs)[index];

      m_clusterizers[partition_index].add_training_vec(v.m_vec, v.m_weight);
    }

    if (m_canceled)
      return;

    const bool is_main_thread = (crn_get_current_thread_id() == m_main_thread_id);

    const bool quick = false;
    m_clusterizers[partition_index].generate_codebook(
        state.m_max_clusters,
        (is_main_thread && !m_cluster_task_displayed_progress) ? generate_codebook_progress_callback : generate_codebook_dummy_progress_callback,
        this,
        quick);

    if (is_main_thread)
      m_cluster_task_displayed_progress = true;

    if (m_canceled)
      return;

    const uint num_clusters = m_clusterizers[partition_index].get_codebook_size();

    m_clusterizers[partition_index].retrieve_clusters(num_clusters, state.m_cluster_indices);

    for (uint i = 0; i < state.m_cluster_indices.size(); i++) {
      crnlib::vector<uint>& indices = state.m_cluster_indices[i];

      for (uint j = 0; j < indices.size(); j++)
        indices[j] = (*state.m_pIndices)[indices[j]];
    }
  }